

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::LocalObjectAddressForSlot::LocalObjectAddressForSlot
          (LocalObjectAddressForSlot *this,ScopeSlots *_pSlotArray,int _slotIndex,Var _value)

{
  (this->super_IDiagObjectAddress)._vptr_IDiagObjectAddress = (_func_int **)&PTR_Set_0137edf0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierPtr
            (&(this->slotArray).slotArray,&_pSlotArray->slotArray);
  this->slotIndex = _slotIndex;
  this->value = _value;
  return;
}

Assistant:

LocalObjectAddressForSlot::LocalObjectAddressForSlot(ScopeSlots _pSlotArray, int _slotIndex, Js::Var _value)
        : slotArray(_pSlotArray),
          slotIndex(_slotIndex),
          value(_value)
    {
    }